

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O3

HelicsFederate helicsGetFederateByName(char *fedName,HelicsError *err)

{
  size_type sVar1;
  char *pcVar2;
  size_t sVar3;
  FedObject *pFVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  HelicsFederate pvVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  size_type *psVar8;
  string_view newError;
  string_view fedName_00;
  string_view newError_00;
  shared_ptr<MasterObjectHolder> mob;
  MasterObjectHolder *local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  size_type local_80;
  undefined8 uStack_78;
  shared_ptr<helics::Federate> local_70;
  MasterObjectHolder *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  MasterObjectHolder *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  if (err == (HelicsError *)0x0) {
    if (fedName != (char *)0x0) {
LAB_0019e7f0:
      getMasterHolder();
      sVar3 = strlen(fedName);
      fedName_00._M_str = fedName;
      fedName_00._M_len = sVar3;
      pFVar4 = MasterObjectHolder::findFed(local_30,fedName_00);
      if (pFVar4 == (FedObject *)0x0) {
        if (err != (HelicsError *)0x0) {
          err->error_code = -4;
          getMasterHolder();
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          sVar3 = strlen(fedName);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,fedName,fedName + sVar3);
          pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_50," is not an active federate identifier");
          psVar8 = (size_type *)(pbVar5->_M_dataplus)._M_p;
          paVar7 = &pbVar5->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8 == paVar7) {
            local_80 = paVar7->_M_allocated_capacity;
            uStack_78 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
            psVar8 = &local_80;
          }
          else {
            local_80 = paVar7->_M_allocated_capacity;
          }
          sVar1 = pbVar5->_M_string_length;
          (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
          pbVar5->_M_string_length = 0;
          (pbVar5->field_2)._M_local_buf[0] = '\0';
          newError_00._M_str = (char *)psVar8;
          newError_00._M_len = sVar1;
          pcVar2 = MasterObjectHolder::addErrorString(local_60,newError_00);
          err->message = pcVar2;
          if (psVar8 != &local_80) {
            operator_delete(psVar8,local_80 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
          }
        }
        pvVar6 = (HelicsFederate)0x0;
      }
      else {
        local_70.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (pFVar4->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
        local_70.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (pFVar4->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
        if (local_70.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_70.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_70.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_70.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_70.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        pvVar6 = generateNewHelicsFederateObject(&local_70,pFVar4->type);
        if (local_70.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_70.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      if (local_28 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return pvVar6;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
      return pvVar6;
    }
  }
  else if (err->error_code == 0) {
    if (fedName != (char *)0x0) goto LAB_0019e7f0;
    err->error_code = -4;
    getMasterHolder();
    newError._M_str = "fedName is empty";
    newError._M_len = 0x10;
    pcVar2 = MasterObjectHolder::addErrorString(local_90,newError);
    err->message = pcVar2;
    if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
    }
  }
  return (HelicsFederate)0x0;
}

Assistant:

HelicsFederate helicsGetFederateByName(const char* fedName, HelicsError* err)
{
    if ((err != nullptr) && (err->error_code != 0)) {
        return nullptr;
    }
    if (fedName == nullptr) {
        if (err != nullptr) {
            err->error_code = HELICS_ERROR_INVALID_ARGUMENT;
            err->message = getMasterHolder()->addErrorString("fedName is empty");
        }
        return nullptr;
    }
    auto mob = getMasterHolder();
    auto* fed = mob->findFed(fedName);
    if (fed == nullptr) {
        if (err != nullptr) {
            err->error_code = HELICS_ERROR_INVALID_ARGUMENT;
            err->message = getMasterHolder()->addErrorString(std::string(fedName) + " is not an active federate identifier");
        }
        return nullptr;
    }
    return generateNewHelicsFederateObject(fed->fedptr, fed->type);
}